

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O0

Tile mercatortile::quadkey_to_tile(string *qk)

{
  Tile TVar1;
  uint uVar2;
  undefined1 *puVar3;
  undefined8 *puVar4;
  int digit;
  int mask;
  int i;
  int ytile;
  int xtile;
  int zoom;
  string *qk_local;
  int iStack_10;
  int local_c;
  
  local_c = std::__cxx11::string::length();
  if (local_c == 0) {
    qk_local._4_4_ = 0;
    iStack_10 = 0;
    local_c = 0;
  }
  else {
    i = 0;
    mask = 0;
    for (digit = local_c; 0 < digit; digit = digit + -1) {
      uVar2 = 1 << ((char)local_c - (char)digit & 0x1fU);
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)qk);
      switch(*puVar3) {
      case 0x30:
        break;
      case 0x31:
        i = i | uVar2;
        break;
      case 0x32:
        mask = mask | uVar2;
        break;
      case 0x33:
        i = i | uVar2;
        mask = mask | uVar2;
        break;
      default:
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = "Unexpected quadkey digit.";
        __cxa_throw(puVar4,&char_const*::typeinfo,0);
      }
    }
    qk_local._4_4_ = i;
    iStack_10 = mask;
  }
  TVar1.y = iStack_10;
  TVar1.x = qk_local._4_4_;
  TVar1.z = local_c;
  return TVar1;
}

Assistant:

Tile quadkey_to_tile(const std::string &qk)
{
    int zoom = qk.length();
    if (zoom == 0)
    {
        return Tile{0,0,0};
    } 
    int xtile = 0;
    int ytile = 0;
    for (int i = zoom; i>0; i--)
    {
        int mask = 1 << (zoom-i);
        int digit = qk[i-1]-'0';
        switch (digit)
        {
            
            case 0:
                break;
            case 1:
                xtile = xtile | mask;
                break;
            case 2:
                ytile = ytile | mask;
                break;
            case 3:
                xtile = xtile | mask;
                ytile = ytile | mask;
                break;
            default:
                throw "Unexpected quadkey digit.";
                break;
        }
    }
    
    return Tile{xtile, ytile, zoom};
}